

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseTopOrGroup
          (StructTranslator *this,Reader members,MemberInfo *parent,StructOrGroup *layout)

{
  short sVar1;
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl;
  Reader decl_00;
  undefined1 auVar2 [16];
  ListElementCount LVar3;
  bool bVar4;
  Union *layout_00;
  uint *codeOrder_00;
  uint codeOrder;
  MemberInfo *memberInfo;
  uint independentSubCodeOrder;
  Reader member;
  uint local_20c;
  MemberInfo *local_208;
  MemberInfo *local_200;
  StructTranslator *local_1f8;
  Arena *local_1f0;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *local_1e8;
  uint local_1dc;
  ArrayPtr<const_char> local_1d8;
  StructOrGroup *local_1c8;
  StructBuilder *local_1c0;
  Reader local_1b8;
  undefined1 local_188 [8];
  CapTableReader *pCStack_180;
  short *local_178;
  WirePointer *pWStack_170;
  int iStack_160;
  undefined4 uStack_15c;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_158;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
  local_150;
  NodeSourceInfoBuilderPair local_140;
  Reader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  Reader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  LVar3 = members.reader.elementCount;
  local_20c = 0;
  local_150.container = &members;
  local_150.index = 0;
  local_1f0 = &this->arena;
  local_1c0 = &(parent->node)._builder;
  local_1e8 = (Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
              &this->allMembers;
  local_158 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
               *)&this->membersByOrdinal;
  local_200 = parent;
  local_1f8 = this;
  local_1c8 = layout;
  do {
    if (local_150.index == LVar3) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*(&local_1b8,&local_150);
    local_208 = (MemberInfo *)0x0;
    if (0x1f < local_1b8._reader.dataSize) {
      sVar1 = *(short *)((long)local_1b8._reader.data + 2);
      if (sVar1 == 8) {
        local_200->childCount = local_200->childCount + 1;
        local_188._0_4_ = local_20c;
        local_20c = local_20c + 1;
        capnp::_::StructBuilder::asReader(local_1c0);
        decl._reader.pointerCount = local_1b8._reader.pointerCount;
        decl._reader._38_2_ = local_1b8._reader._38_2_;
        decl._reader.dataSize = local_1b8._reader.dataSize;
        parent_00._reader.capTable = (CapTableReader *)uStack_b8;
        parent_00._reader.segment = (SegmentReader *)local_c0;
        parent_00._reader.data = (void *)local_b0;
        parent_00._reader.pointers = (WirePointer *)uStack_a8;
        parent_00._reader.dataSize = (undefined4)local_a0;
        parent_00._reader.pointerCount = local_a0._4_2_;
        parent_00._reader._38_2_ = local_a0._6_2_;
        parent_00._reader._40_8_ = uStack_98;
        decl._reader.capTable = local_1b8._reader.capTable;
        decl._reader.segment = local_1b8._reader.segment;
        decl._reader.data = local_1b8._reader.data;
        decl._reader.pointers = local_1b8._reader.pointers;
        decl._reader.nestingLimit = local_1b8._reader.nestingLimit;
        decl._reader._44_4_ = local_1b8._reader._44_4_;
        newGroupNode(&local_140,local_1f8,parent_00,decl);
        local_1d8.ptr = (char *)((ulong)local_1d8.ptr & 0xffffffffffffff00);
        local_208 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                              (local_1f0,local_200,(uint *)local_188,&local_1b8,&local_140,
                               (bool *)&local_1d8);
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>(local_1e8,&local_208);
        Declaration::Reader::getNestedDecls(&local_f0,&local_1b8);
        members_00.reader.capTable = local_f0.reader.capTable;
        members_00.reader.segment = local_f0.reader.segment;
        members_00.reader.ptr = local_f0.reader.ptr;
        members_00.reader.elementCount = local_f0.reader.elementCount;
        members_00.reader.step = local_f0.reader.step;
        members_00.reader.structDataSize = local_f0.reader.structDataSize;
        members_00.reader.structPointerCount = local_f0.reader.structPointerCount;
        members_00.reader.elementSize = local_f0.reader.elementSize;
        members_00.reader._39_1_ = local_f0.reader._39_1_;
        members_00.reader.nestingLimit = local_f0.reader.nestingLimit;
        members_00.reader._44_4_ = local_f0.reader._44_4_;
        traverseGroup(local_1f8,members_00,local_208,layout);
      }
      else if (sVar1 == 7) {
        layout_00 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&>
                              (local_1f0,layout);
        local_1dc = 0;
        Declaration::Reader::getName((Reader *)&local_140,&local_1b8);
        _local_188 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&local_140);
        local_1d8.ptr = "";
        local_1d8.size_ = 1;
        bVar4 = kj::ArrayPtr<const_char>::operator==((ArrayPtr<const_char> *)local_188,&local_1d8);
        if (bVar4) {
          local_208 = local_200;
          codeOrder_00 = &local_20c;
        }
        else {
          local_200->childCount = local_200->childCount + 1;
          local_188._0_4_ = local_20c;
          local_20c = local_20c + 1;
          capnp::_::StructBuilder::asReader(local_1c0);
          decl_00._reader.pointerCount = local_1b8._reader.pointerCount;
          decl_00._reader._38_2_ = local_1b8._reader._38_2_;
          decl_00._reader.dataSize = local_1b8._reader.dataSize;
          parent_01._reader.capTable = (CapTableReader *)uStack_58;
          parent_01._reader.segment = (SegmentReader *)local_60;
          parent_01._reader.data = (void *)local_50;
          parent_01._reader.pointers = (WirePointer *)uStack_48;
          parent_01._reader.dataSize = (undefined4)local_40;
          parent_01._reader.pointerCount = local_40._4_2_;
          parent_01._reader._38_2_ = local_40._6_2_;
          parent_01._reader._40_8_ = uStack_38;
          decl_00._reader.capTable = local_1b8._reader.capTable;
          decl_00._reader.segment = local_1b8._reader.segment;
          decl_00._reader.data = local_1b8._reader.data;
          decl_00._reader.pointers = local_1b8._reader.pointers;
          decl_00._reader.nestingLimit = local_1b8._reader.nestingLimit;
          decl_00._reader._44_4_ = local_1b8._reader._44_4_;
          newGroupNode(&local_140,local_1f8,parent_01,decl_00);
          local_1d8.ptr = (char *)((ulong)local_1d8.ptr & 0xffffffffffffff00);
          local_208 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                                (local_1f0,local_200,(uint *)local_188,&local_1b8,&local_140,
                                 (bool *)&local_1d8);
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
          add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>(local_1e8,&local_208)
          ;
          codeOrder_00 = &local_1dc;
        }
        (local_208->field_21).unionScope = layout_00;
        Declaration::Reader::getNestedDecls(&local_90,&local_1b8);
        members_01.reader.capTable = local_90.reader.capTable;
        members_01.reader.segment = local_90.reader.segment;
        members_01.reader.ptr = local_90.reader.ptr;
        members_01.reader.elementCount = local_90.reader.elementCount;
        members_01.reader.step = local_90.reader.step;
        members_01.reader.structDataSize = local_90.reader.structDataSize;
        members_01.reader.structPointerCount = local_90.reader.structPointerCount;
        members_01.reader.elementSize = local_90.reader.elementSize;
        members_01.reader._39_1_ = local_90.reader._39_1_;
        members_01.reader.nestingLimit = local_90.reader.nestingLimit;
        members_01.reader._44_4_ = local_90.reader._44_4_;
        traverseUnion(local_1f8,&local_1b8,members_01,local_208,layout_00,codeOrder_00);
        layout = local_1c8;
        if ((0xf < local_1b8._reader.dataSize) && (*local_1b8._reader.data == 2)) {
          iStack_160 = local_1b8._reader.nestingLimit;
          uStack_15c = local_1b8._reader._44_4_;
          local_178 = (short *)local_1b8._reader.data;
          pWStack_170 = local_1b8._reader.pointers;
          pCStack_180 = local_1b8._reader.capTable;
          local_188 = (undefined1  [8])local_1b8._reader.segment;
          Declaration::Id::Reader::getOrdinal((Reader *)&local_140,(Reader *)local_188);
          local_140.node._builder.segment._0_4_ = 0;
          layout = local_1c8;
          if (0x3f < local_140.node._builder.dataSize) {
            local_140.node._builder.segment._0_4_ = *local_140.node._builder.data;
          }
          goto LAB_001606d8;
        }
      }
      else if (sVar1 == 6) {
        local_200->childCount = local_200->childCount + 1;
        local_140.node._builder.segment._0_4_ = local_20c;
        auVar2[0xf] = 0;
        auVar2._0_15_ = stack0xfffffffffffffe79;
        _local_188 = (ArrayPtr<const_char>)(auVar2 << 8);
        local_20c = local_20c + 1;
        local_208 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                              (local_1f0,local_200,(uint *)&local_140,&local_1b8,layout,
                               (bool *)local_188);
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>(local_1e8,&local_208);
        iStack_160 = local_1b8._reader.nestingLimit;
        uStack_15c = local_1b8._reader._44_4_;
        local_178 = (short *)local_1b8._reader.data;
        pWStack_170 = local_1b8._reader.pointers;
        pCStack_180 = local_1b8._reader.capTable;
        local_188 = (undefined1  [8])local_1b8._reader.segment;
        Declaration::Id::Reader::getOrdinal((Reader *)&local_140,(Reader *)local_188);
        local_140.node._builder.segment._0_4_ = 0;
        if (0x3f < local_140.node._builder.dataSize) {
          local_140.node._builder.segment._0_4_ = *local_140.node._builder.data;
        }
LAB_001606d8:
        local_140.node._builder.capTable = (CapTableBuilder *)local_208;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                  (local_158,
                   (pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                    *)&local_140);
      }
    }
    local_150.index = local_150.index + 1;
  } while( true );
}

Assistant:

void traverseTopOrGroup(List<Declaration>::Reader members, MemberInfo& parent,
                          StructLayout::StructOrGroup& layout) {
    uint codeOrder = 0;

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member, layout, false);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION: {
          StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(layout);

          uint independentSubCodeOrder = 0;
          uint* subCodeOrder = &independentSubCodeOrder;
          if (member.getName().getValue() == "") {
            memberInfo = &parent;
            subCodeOrder = &codeOrder;
          } else {
            parent.childCount++;
            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                false);
            allMembers.add(memberInfo);
          }
          memberInfo->unionScope = &unionLayout;
          traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, *subCodeOrder);
          if (member.getId().isOrdinal()) {
            ordinal = member.getId().getOrdinal().getValue();
          }
          break;
        }

        case Declaration::GROUP:
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              false);
          allMembers.add(memberInfo);

          // Members of the group are laid out just like they were members of the parent, so we
          // just pass along the parent layout.
          traverseGroup(member.getNestedDecls(), *memberInfo, layout);

          // No ordinal for groups.
          break;

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }